

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botl.c
# Opt level: O0

void max_rank_sz(void)

{
  size_t sVar1;
  int local_14;
  int maxr;
  int r;
  int i;
  
  local_14 = 0;
  for (maxr = 0; maxr < 9; maxr = maxr + 1) {
    if (urole.rank[maxr].m != (char *)0x0) {
      sVar1 = strlen(urole.rank[maxr].m);
      if (local_14 < (int)sVar1) {
        local_14 = (int)sVar1;
      }
    }
    if (urole.rank[maxr].f != (char *)0x0) {
      sVar1 = strlen(urole.rank[maxr].f);
      if (local_14 < (int)sVar1) {
        local_14 = (int)sVar1;
      }
    }
  }
  mrank_sz = local_14;
  return;
}

Assistant:

void max_rank_sz(void)
{
	int i, r, maxr = 0;
	for (i = 0; i < 9; i++) {
	    if (urole.rank[i].m && (r = strlen(urole.rank[i].m)) > maxr) maxr = r;
	    if (urole.rank[i].f && (r = strlen(urole.rank[i].f)) > maxr) maxr = r;
	}
	mrank_sz = maxr;
	return;
}